

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.cpp
# Opt level: O2

void __thiscall
duckdb::roaring::ContainerMetadataCollection::AddBitsetContainer(ContainerMetadataCollection *this)

{
  uchar local_9;
  
  AddContainerType(this,false,false);
  local_9 = 0xf9;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&(this->cardinality).super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
             &local_9);
  this->arrays_in_segment = this->arrays_in_segment + 1;
  this->count_in_segment = this->count_in_segment + 1;
  return;
}

Assistant:

void ContainerMetadataCollection::AddBitsetContainer() {
	AddContainerType(false, false);
	cardinality.push_back(BITSET_CONTAINER_SENTINEL_VALUE);
	arrays_in_segment++;
	count_in_segment++;
}